

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
pstd::
vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::operator=(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *this,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *other)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  undefined8 *puVar5;
  size_t sVar6;
  undefined8 uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  
  if (this != other) {
    if ((this->alloc).memoryResource == (other->alloc).memoryResource) {
      pbVar3 = this->ptr;
      this->ptr = other->ptr;
      other->ptr = pbVar3;
      sVar6 = this->nAlloc;
      this->nAlloc = other->nAlloc;
      other->nAlloc = sVar6;
      sVar6 = this->nStored;
      this->nStored = other->nStored;
      other->nStored = sVar6;
    }
    else {
      clear(this);
      reserve(this,other->nStored);
      uVar10 = other->nStored;
      if (uVar10 != 0) {
        lVar8 = 0x10;
        uVar9 = 0;
        do {
          pbVar3 = this->ptr;
          puVar1 = (undefined8 *)((long)&(pbVar3->_M_dataplus)._M_p + lVar8);
          pbVar4 = other->ptr;
          puVar2 = (undefined8 *)((long)&(pbVar4->_M_dataplus)._M_p + lVar8);
          *(undefined8 **)((long)pbVar3 + lVar8 + -0x10) = puVar1;
          puVar5 = *(undefined8 **)((long)pbVar4 + lVar8 + -0x10);
          if (puVar2 == puVar5) {
            uVar7 = puVar2[1];
            *puVar1 = *puVar2;
            puVar1[1] = uVar7;
          }
          else {
            puVar1[-2] = puVar5;
            *puVar1 = *puVar2;
          }
          *(undefined8 *)((long)pbVar3 + lVar8 + -8) = *(undefined8 *)((long)pbVar4 + lVar8 + -8);
          *(undefined8 **)((long)pbVar4 + lVar8 + -0x10) = puVar2;
          *(undefined8 *)((long)pbVar4 + lVar8 + -8) = 0;
          *(undefined1 *)((long)&(pbVar4->_M_dataplus)._M_p + lVar8) = 0;
          uVar9 = uVar9 + 1;
          uVar10 = other->nStored;
          lVar8 = lVar8 + 0x20;
        } while (uVar9 < uVar10);
      }
      this->nStored = uVar10;
    }
  }
  return this;
}

Assistant:

vector &operator=(vector &&other) {
        if (this == &other)
            return *this;

        if (alloc == other.alloc) {
            pstd::swap(ptr, other.ptr);
            pstd::swap(nAlloc, other.nAlloc);
            pstd::swap(nStored, other.nStored);
        } else {
            clear();
            reserve(other.size());
            for (size_t i = 0; i < other.size(); ++i)
                alloc.template construct<T>(ptr + i, std::move(other[i]));
            nStored = other.size();
        }

        return *this;
    }